

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::
AddFile<google::protobuf::FileDescriptorProto>
          (DescriptorIndex *this,FileDescriptorProto *file,Value value)

{
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_01;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_02;
  String *__return_storage_ptr__;
  char *pcVar1;
  anon_unknown_23 *this_03;
  DescriptorProto *message_type;
  FieldDescriptorProto *field;
  bool bVar2;
  bool bVar3;
  undefined8 *puVar4;
  void **ppvVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  LogMessage *pLVar9;
  const_iterator cVar10;
  char *extraout_RDX;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *this_04;
  string_view str;
  string_view str_00;
  string_view name;
  string_view symbol;
  string_view filename;
  string_view symbol_00;
  string_view symbol_01;
  string_view filename_00;
  string_view symbol_02;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>,_bool>
  local_48;
  
  local_78._0_8_ = value.first;
  local_78._8_4_ = value.second;
  local_68._0_8_ = &local_58;
  local_68._8_8_ = 0;
  local_58._M_local_buf[0] = '\0';
  std::
  vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
  ::emplace_back<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>
            (&this->all_values_,(EncodedEntry *)local_78);
  std::__cxx11::string::~string((string *)local_68);
  puVar4 = (undefined8 *)
           ((ulong)(file->field_0)._impl_.package_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  pcVar1 = (char *)*puVar4;
  this_03 = (anon_unknown_23 *)puVar4[1];
  name._M_str = extraout_RDX;
  name._M_len = (size_t)pcVar1;
  bVar2 = anon_unknown_23::ValidateSymbolName(this_03,name);
  if (bVar2) {
    str._M_str = pcVar1;
    str._M_len = (size_t)this_03;
    EncodeString_abi_cxx11_((String *)local_78,this,str);
    std::__cxx11::string::operator=
              ((string *)
               &(this->all_values_).
                super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].encoded_package,(string *)local_78);
    std::__cxx11::string::~string((string *)local_78);
    local_78._0_4_ =
         (int)(((long)(this->all_values_).
                      super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->all_values_).
                     super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x30) + -1;
    __return_storage_ptr__ = (String *)(local_78 + 8);
    puVar4 = (undefined8 *)
             ((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    str_00._M_str = (char *)*puVar4;
    str_00._M_len = puVar4[1];
    EncodeString_abi_cxx11_(__return_storage_ptr__,this,str_00);
    absl::lts_20250127::container_internal::
    btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
    ::insert(&local_48,
             &(this->by_name_).
              super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
             ,(value_type *)local_78);
    if (local_48.second == true) {
      bVar2 = std::
              binary_search<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>>>,std::__cxx11::string,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare>
                        ((this->by_name_flat_).
                         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->by_name_flat_).
                         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
                         ,(this->by_name_).
                          super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
                          .
                          super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
                          .tree_.rightmost_.
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>::checked_compare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>::checked_compare,_0UL,_false>
                          .value.
                          super_checked_compare_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_true>
                          .super_FileCompare.index);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      if (!bVar2) {
        this_00 = &(file->field_0)._impl_.message_type_;
        ppvVar5 = internal::RepeatedPtrFieldBase::elements(&this_00->super_RepeatedPtrFieldBase);
        cVar6 = RepeatedPtrField<google::protobuf::DescriptorProto>::end(this_00);
        while( true ) {
          if (ppvVar5 == cVar6.it_) {
            this_01 = &(file->field_0)._impl_.enum_type_;
            ppvVar5 = internal::RepeatedPtrFieldBase::elements(&this_01->super_RepeatedPtrFieldBase)
            ;
            cVar7 = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::end(this_01);
            do {
              if (ppvVar5 == cVar7.it_) {
                this_02 = &(file->field_0)._impl_.extension_;
                ppvVar5 = internal::RepeatedPtrFieldBase::elements
                                    (&this_02->super_RepeatedPtrFieldBase);
                cVar8 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::end(this_02);
                while( true ) {
                  if (ppvVar5 == cVar8.it_) {
                    this_04 = &(file->field_0)._impl_.service_;
                    ppvVar5 = internal::RepeatedPtrFieldBase::elements
                                        (&this_04->super_RepeatedPtrFieldBase);
                    cVar10 = RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::end
                                       (this_04);
                    do {
                      bVar2 = ppvVar5 == cVar10.it_;
                      if (bVar2) {
                        return bVar2;
                      }
                      puVar4 = (undefined8 *)
                               (*(ulong *)((long)*ppvVar5 + 0x30) & 0xfffffffffffffffc);
                      symbol_02._M_str = (char *)*puVar4;
                      symbol_02._M_len = puVar4[1];
                      bVar3 = AddSymbol(this,symbol_02);
                      ppvVar5 = ppvVar5 + 1;
                    } while (bVar3);
                    return bVar2;
                  }
                  field = (FieldDescriptorProto *)*ppvVar5;
                  puVar4 = (undefined8 *)
                           ((ulong)(field->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                           0xfffffffffffffffc);
                  symbol_01._M_str = (char *)*puVar4;
                  symbol_01._M_len = puVar4[1];
                  bVar2 = AddSymbol(this,symbol_01);
                  if (!bVar2) break;
                  puVar4 = (undefined8 *)
                           ((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                           0xfffffffffffffffc);
                  filename_00._M_str = (char *)*puVar4;
                  filename_00._M_len = puVar4[1];
                  bVar2 = AddExtension<google::protobuf::FieldDescriptorProto>
                                    (this,filename_00,field);
                  ppvVar5 = ppvVar5 + 1;
                  if (!bVar2) {
                    return false;
                  }
                }
                return false;
              }
              puVar4 = (undefined8 *)(*(ulong *)((long)*ppvVar5 + 0x60) & 0xfffffffffffffffc);
              symbol_00._M_str = (char *)*puVar4;
              symbol_00._M_len = puVar4[1];
              bVar2 = AddSymbol(this,symbol_00);
              ppvVar5 = ppvVar5 + 1;
            } while (bVar2);
            return false;
          }
          message_type = (DescriptorProto *)*ppvVar5;
          puVar4 = (undefined8 *)
                   ((ulong)(message_type->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                   0xfffffffffffffffc);
          symbol._M_str = (char *)*puVar4;
          symbol._M_len = puVar4[1];
          bVar2 = AddSymbol(this,symbol);
          if (!bVar2) break;
          puVar4 = (undefined8 *)
                   ((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
          filename._M_str = (char *)*puVar4;
          filename._M_len = puVar4[1];
          bVar2 = AddNestedExtensions<google::protobuf::DescriptorProto>(this,filename,message_type)
          ;
          ppvVar5 = ppvVar5 + 1;
          if (!bVar2) {
            return false;
          }
        }
        return false;
      }
    }
    else {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              ((LogMessage *)local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x2a6);
    pLVar9 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       ((LogMessage *)local_78,(char (*) [34])"File already exists in database: ");
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (pLVar9,(string *)
                      ((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              ((LogMessage *)local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x29b);
    pLVar9 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       ((LogMessage *)local_78,(char (*) [23])"Invalid package name: ");
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (pLVar9,(string *)
                      ((ulong)(file->field_0)._impl_.package_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
              );
  }
  absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)local_78);
  return false;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddFile(const FileProto& file,
                                                         Value value) {
  // We push `value` into the array first. This is important because the AddXXX
  // functions below will expect it to be there.
  all_values_.push_back({value.first, value.second, {}});

  if (!ValidateSymbolName(file.package())) {
    ABSL_LOG(ERROR) << "Invalid package name: " << file.package();
    return false;
  }
  all_values_.back().encoded_package = EncodeString(file.package());

  if (!by_name_
           .insert({static_cast<int>(all_values_.size() - 1),
                    EncodeString(file.name())})
           .second ||
      std::binary_search(by_name_flat_.begin(), by_name_flat_.end(),
                         file.name(), by_name_.key_comp())) {
    ABSL_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  for (const auto& message_type : file.message_type()) {
    if (!AddSymbol(message_type.name())) return false;
    if (!AddNestedExtensions(file.name(), message_type)) return false;
  }
  for (const auto& enum_type : file.enum_type()) {
    if (!AddSymbol(enum_type.name())) return false;
  }
  for (const auto& extension : file.extension()) {
    if (!AddSymbol(extension.name())) return false;
    if (!AddExtension(file.name(), extension)) return false;
  }
  for (const auto& service : file.service()) {
    if (!AddSymbol(service.name())) return false;
  }

  return true;
}